

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_> *
toml::ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
          (tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *v)

{
  tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *in_RDI;
  tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *this;
  
  this = in_RDI;
  std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>::tuple
            (in_RDI,in_RDI);
  success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>::
  success((success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
           *)this,in_RDI);
  std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>::~tuple
            ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *)0x761ccd
            );
  return (success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
          *)this;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}